

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false>::
visit<slang::ast::SpecifyBlockSymbol>
          (ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *this,
          SpecifyBlockSymbol *t)

{
  SpecifyBlockSymbol *in_stack_00000028;
  ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *in_stack_00000030;
  
  visitDefault<slang::ast::SpecifyBlockSymbol>(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }